

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::AppendDescriptorChecksumRequest::AppendDescriptorChecksumRequest
          (AppendDescriptorChecksumRequest *this)

{
  allocator local_11;
  AppendDescriptorChecksumRequest *local_10;
  AppendDescriptorChecksumRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>).
  _vptr_JsonClassBase = (_func_int **)&PTR__AppendDescriptorChecksumRequest_01b3cd28;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->descriptor_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->is_elements_ = false;
  CollectFieldName();
  return;
}

Assistant:

AppendDescriptorChecksumRequest() {
    CollectFieldName();
  }